

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void SparseKeygenRecurse<Blob<16>,unsigned_long>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<16> *k,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  uint32_t start_00;
  iterator __position;
  unsigned_long h;
  unsigned_long local_38;
  
  if (start < 0x10) {
    do {
      flipbit(k,2,start);
      if (bitsleft == 1 || inclusive) {
        (*hash)(k,2,0,&local_38);
        __position._M_current =
             (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)hashes,__position,
                     &local_38);
        }
        else {
          *__position._M_current = local_38;
          (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      start_00 = start + 1;
      if (1 < bitsleft) {
        SparseKeygenRecurse<Blob<16>,unsigned_long>(hash,start_00,bitsleft + -1,inclusive,k,hashes);
      }
      flipbit(k,2,start);
      start = start_00;
    } while (start_00 != 0x10);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}